

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int incrPhraseTokenNext(Fts3Table *pTab,Fts3Phrase *pPhrase,int iToken,TokenDoclist *p,u8 *pbEof)

{
  Fts3Doclist *in_RCX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  u8 *in_R8;
  Fts3PhraseToken *pToken;
  sqlite3_int64 *in_stack_00000008;
  int rc;
  int local_2c;
  undefined4 in_stack_ffffffffffffffe8;
  
  local_2c = 0;
  if (*(int *)(in_RSI + 0x3c) == in_EDX) {
    fts3EvalDlPhraseNext((Fts3Table *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX,in_R8);
    in_RCX->pNextDocid = *(char **)(in_RSI + 0x28);
    *(undefined4 *)&in_RCX->iDocid = *(undefined4 *)(in_RSI + 0x30);
    *(undefined8 *)&in_RCX->nAll = *(undefined8 *)(in_RSI + 0x18);
  }
  else if (*(long *)(in_RSI + (long)in_EDX * 0x28 + 0x78) == 0) {
    *(undefined4 *)&in_RCX->aAll = 1;
  }
  else {
    local_2c = sqlite3Fts3MsrIncrNext
                         ((Fts3Table *)p,(Fts3MultiSegReader *)pbEof,in_stack_00000008,&pToken->z,
                          in_RDI);
    if (in_RCX->pNextDocid == (char *)0x0) {
      *in_R8 = '\x01';
    }
  }
  return local_2c;
}

Assistant:

static int incrPhraseTokenNext(
  Fts3Table *pTab,                /* Virtual table handle */
  Fts3Phrase *pPhrase,            /* Phrase to advance token of */
  int iToken,                     /* Specific token to advance */
  TokenDoclist *p,                /* OUT: Docid and doclist for new entry */
  u8 *pbEof                       /* OUT: True if iterator is at EOF */
){
  int rc = SQLITE_OK;

  if( pPhrase->iDoclistToken==iToken ){
    assert( p->bIgnore==0 );
    assert( pPhrase->aToken[iToken].pSegcsr==0 );
    fts3EvalDlPhraseNext(pTab, &pPhrase->doclist, pbEof);
    p->pList = pPhrase->doclist.pList;
    p->nList = pPhrase->doclist.nList;
    p->iDocid = pPhrase->doclist.iDocid;
  }else{
    Fts3PhraseToken *pToken = &pPhrase->aToken[iToken];
    assert( pToken->pDeferred==0 );
    assert( pToken->pSegcsr || pPhrase->iDoclistToken>=0 );
    if( pToken->pSegcsr ){
      assert( p->bIgnore==0 );
      rc = sqlite3Fts3MsrIncrNext(
          pTab, pToken->pSegcsr, &p->iDocid, &p->pList, &p->nList
      );
      if( p->pList==0 ) *pbEof = 1;
    }else{
      p->bIgnore = 1;
    }
  }

  return rc;
}